

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall iu_Matcher_x_iutest_x___Test::Body(iu_Matcher_x_iutest_x___Test *this)

{
  return;
}

Assistant:

IUTEST(Matcher, _)
{
    IUTEST_EXPECT_THAT( 42, _);
    IUTEST_EXPECT_THAT( gx, _);
    IUTEST_EXPECT_THAT(&gx, _);
}